

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical_hash_join.cpp
# Opt level: O2

void __thiscall duckdb::HashJoinTableInitEvent::Schedule(HashJoinTableInitEvent *this)

{
  HashJoinTableInitTask *pHVar1;
  bool bVar2;
  Pipeline *this_00;
  type pJVar3;
  ulong uVar4;
  ulong uVar5;
  vector<duckdb::shared_ptr<duckdb::Task,_true>,_true> finalize_tasks;
  unsigned_long entry_idx_to;
  idx_t entry_count;
  _Head_base<0UL,_duckdb::HashJoinTableInitTask_*,_false> local_b8;
  long *local_b0;
  enable_shared_from_this<duckdb::Event> local_a8;
  shared_ptr<duckdb::Task,_true> local_98;
  vector<duckdb::shared_ptr<duckdb::Task,_true>,_std::allocator<duckdb::shared_ptr<duckdb::Task,_true>_>_>
  local_88;
  ClientContext *local_68;
  HashJoinTableInitTask *local_60;
  enable_shared_from_this<duckdb::Event> *local_58;
  HashJoinTableInitTask *local_50;
  vector<duckdb::shared_ptr<duckdb::Task,_true>,_std::allocator<duckdb::shared_ptr<duckdb::Task,_true>_>_>
  local_48;
  
  this_00 = shared_ptr<duckdb::Pipeline,_true>::operator->
                      (&(this->super_BasePipelineEvent).pipeline);
  local_68 = Pipeline::GetClientContext(this_00);
  local_88.
  super__Vector_base<duckdb::shared_ptr<duckdb::Task,_true>,_std::allocator<duckdb::shared_ptr<duckdb::Task,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_88.
  super__Vector_base<duckdb::shared_ptr<duckdb::Task,_true>,_std::allocator<duckdb::shared_ptr<duckdb::Task,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_88.
  super__Vector_base<duckdb::shared_ptr<duckdb::Task,_true>,_std::allocator<duckdb::shared_ptr<duckdb::Task,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  pJVar3 = unique_ptr<duckdb::JoinHashTable,_std::default_delete<duckdb::JoinHashTable>,_true>::
           operator*(&this->sink->hash_table);
  pHVar1 = (HashJoinTableInitTask *)pJVar3->capacity;
  uVar5 = this->sink->num_threads;
  local_50 = pHVar1;
  bVar2 = FinalizeSingleThreaded(this->sink,false);
  if (bVar2) {
    enable_shared_from_this<duckdb::Event>::shared_from_this(&local_a8);
    local_60 = (HashJoinTableInitTask *)((ulong)local_60 & 0xffffffff00000000);
    make_uniq<duckdb::HashJoinTableInitTask,duckdb::shared_ptr<duckdb::Event,true>,duckdb::ClientContext&,duckdb::HashJoinGlobalSinkState&,unsigned_int,unsigned_long_const&,duckdb::PhysicalHashJoin_const&>
              ((duckdb *)&local_b8,(shared_ptr<duckdb::Event,_true> *)&local_a8,local_68,this->sink,
               (uint *)&local_60,(unsigned_long *)&local_50,this->sink->op);
    shared_ptr<duckdb::Task,_true>::
    shared_ptr<duckdb::HashJoinTableInitTask,_std::default_delete<duckdb::HashJoinTableInitTask>,_true,_0>
              (&local_98,
               (unique_ptr<duckdb::HashJoinTableInitTask,_std::default_delete<duckdb::HashJoinTableInitTask>,_true>
                *)&local_b8);
    ::std::
    vector<duckdb::shared_ptr<duckdb::Task,true>,std::allocator<duckdb::shared_ptr<duckdb::Task,true>>>
    ::emplace_back<duckdb::shared_ptr<duckdb::Task,true>>
              ((vector<duckdb::shared_ptr<duckdb::Task,true>,std::allocator<duckdb::shared_ptr<duckdb::Task,true>>>
                *)&local_88,&local_98);
    ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
               &local_98.internal.super___shared_ptr<duckdb::Task,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
    if (local_b8._M_head_impl != (HashJoinTableInitTask *)0x0) {
      (*((local_b8._M_head_impl)->super_ExecutorTask).super_Task._vptr_Task[1])();
    }
    local_b8._M_head_impl = (HashJoinTableInitTask *)0x0;
    ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
               &local_a8.__weak_this_.internal.
                super___weak_ptr<duckdb::Event,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  }
  else {
    local_b8._M_head_impl = (HashJoinTableInitTask *)0x0;
    uVar4 = (ulong)pHVar1 / uVar5 >> 2;
    uVar5 = 0x20000;
    if (0x20000 < uVar4) {
      uVar5 = uVar4;
    }
    local_58 = &(this->super_BasePipelineEvent).super_Event.
                super_enable_shared_from_this<duckdb::Event>;
    for (; local_b8._M_head_impl < pHVar1;
        local_b8._M_head_impl =
             (HashJoinTableInitTask *)
             ((long)&((local_b8._M_head_impl)->super_ExecutorTask).super_Task._vptr_Task + uVar5)) {
      local_60 = (HashJoinTableInitTask *)
                 ((long)&((local_b8._M_head_impl)->super_ExecutorTask).super_Task._vptr_Task + uVar5
                 );
      if (pHVar1 <= local_60) {
        local_60 = pHVar1;
      }
      enable_shared_from_this<duckdb::Event>::shared_from_this(&local_a8);
      make_uniq<duckdb::HashJoinTableInitTask,duckdb::shared_ptr<duckdb::Event,true>,duckdb::ClientContext&,duckdb::HashJoinGlobalSinkState&,unsigned_long&,unsigned_long&,duckdb::PhysicalHashJoin_const&>
                ((duckdb *)&local_b0,(shared_ptr<duckdb::Event,_true> *)&local_a8,local_68,
                 this->sink,(unsigned_long *)&local_b8,(unsigned_long *)&local_60,this->sink->op);
      shared_ptr<duckdb::Task,_true>::
      shared_ptr<duckdb::HashJoinTableInitTask,_std::default_delete<duckdb::HashJoinTableInitTask>,_true,_0>
                (&local_98,
                 (unique_ptr<duckdb::HashJoinTableInitTask,_std::default_delete<duckdb::HashJoinTableInitTask>,_true>
                  *)&local_b0);
      ::std::
      vector<duckdb::shared_ptr<duckdb::Task,true>,std::allocator<duckdb::shared_ptr<duckdb::Task,true>>>
      ::emplace_back<duckdb::shared_ptr<duckdb::Task,true>>
                ((vector<duckdb::shared_ptr<duckdb::Task,true>,std::allocator<duckdb::shared_ptr<duckdb::Task,true>>>
                  *)&local_88,&local_98);
      ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                 &local_98.internal.super___shared_ptr<duckdb::Task,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount);
      if (local_b0 != (long *)0x0) {
        (**(code **)(*local_b0 + 8))();
      }
      local_b0 = (long *)0x0;
      ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                 &local_a8.__weak_this_.internal.
                  super___weak_ptr<duckdb::Event,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    }
  }
  local_48.
  super__Vector_base<duckdb::shared_ptr<duckdb::Task,_true>,_std::allocator<duckdb::shared_ptr<duckdb::Task,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       local_88.
       super__Vector_base<duckdb::shared_ptr<duckdb::Task,_true>,_std::allocator<duckdb::shared_ptr<duckdb::Task,_true>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  local_48.
  super__Vector_base<duckdb::shared_ptr<duckdb::Task,_true>,_std::allocator<duckdb::shared_ptr<duckdb::Task,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       local_88.
       super__Vector_base<duckdb::shared_ptr<duckdb::Task,_true>,_std::allocator<duckdb::shared_ptr<duckdb::Task,_true>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  local_48.
  super__Vector_base<duckdb::shared_ptr<duckdb::Task,_true>,_std::allocator<duckdb::shared_ptr<duckdb::Task,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       local_88.
       super__Vector_base<duckdb::shared_ptr<duckdb::Task,_true>,_std::allocator<duckdb::shared_ptr<duckdb::Task,_true>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  local_88.
  super__Vector_base<duckdb::shared_ptr<duckdb::Task,_true>,_std::allocator<duckdb::shared_ptr<duckdb::Task,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_88.
  super__Vector_base<duckdb::shared_ptr<duckdb::Task,_true>,_std::allocator<duckdb::shared_ptr<duckdb::Task,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_88.
  super__Vector_base<duckdb::shared_ptr<duckdb::Task,_true>,_std::allocator<duckdb::shared_ptr<duckdb::Task,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  Event::SetTasks((Event *)this,(vector<duckdb::shared_ptr<duckdb::Task,_true>,_true> *)&local_48);
  ::std::
  vector<duckdb::shared_ptr<duckdb::Task,_true>,_std::allocator<duckdb::shared_ptr<duckdb::Task,_true>_>_>
  ::~vector(&local_48);
  ::std::
  vector<duckdb::shared_ptr<duckdb::Task,_true>,_std::allocator<duckdb::shared_ptr<duckdb::Task,_true>_>_>
  ::~vector(&local_88);
  return;
}

Assistant:

void Schedule() override {
		auto &context = pipeline->GetClientContext();
		vector<shared_ptr<Task>> finalize_tasks;
		auto &ht = *sink.hash_table;
		const auto entry_count = ht.capacity;
		auto num_threads = NumericCast<idx_t>(sink.num_threads);

		// we don't have to check whether it is too skewed here, as we only initialize the pointer table
		if (FinalizeSingleThreaded(sink, false)) {
			// Single-threaded memset
			finalize_tasks.push_back(
			    make_uniq<HashJoinTableInitTask>(shared_from_this(), context, sink, 0U, entry_count, sink.op));
		} else {
			// have 4 times more tasks than threads, but bound the to a minimum
			const idx_t entries_per_task = MaxValue(entry_count / num_threads / 4, MINIMUM_ENTRIES_PER_TASK);
			// Parallel memset
			for (idx_t entry_idx = 0; entry_idx < entry_count; entry_idx += entries_per_task) {
				auto entry_idx_to = MinValue<idx_t>(entry_idx + entries_per_task, entry_count);
				finalize_tasks.push_back(make_uniq<HashJoinTableInitTask>(shared_from_this(), context, sink, entry_idx,
				                                                          entry_idx_to, sink.op));
			}
		}
		SetTasks(std::move(finalize_tasks));
	}